

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dacload.c
# Opt level: O2

int envy_bios_parse_bit_A(envy_bios *bios,envy_bios_bit_entry *bit)

{
  long lVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  (bios->dacload).bit = bit;
  uVar3 = bit->t_len;
  if (uVar3 < 3) {
    fprintf(_stderr,"Analog load table too short: %d < %d\n",(ulong)uVar3,3);
    iVar6 = -0x16;
  }
  else {
    if (uVar3 != 3) {
      fprintf(_stderr,"Analog load table longer than expected: %d > %d\n",(ulong)uVar3,3);
    }
    if ((bios->dacload).valid == '\0') {
      lVar1 = (ulong)bit->t_offset + 1;
      iVar6 = -0xe;
      if ((uint)lVar1 < bios->length) {
        (bios->dacload).offset = CONCAT11(bios->data[lVar1],bios->data[bit->t_offset]);
        iVar5 = 0;
      }
      else {
        (bios->dacload).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        iVar5 = iVar6;
      }
      iVar4 = bios_u8(bios,bit->t_offset + 2,&(bios->dacload).unk02);
      if (iVar4 == 0 && iVar5 == 0) {
        iVar5 = envy_bios_parse_dacload(bios);
        iVar6 = 0;
        if (iVar5 != 0) {
          bVar2 = (bios->dacload).version;
          iVar6 = 0;
          fprintf(_stderr,"Failed to parse DACLOAD table at 0x%04x version %d.%d\n",
                  (ulong)(bios->dacload).offset,(ulong)(bVar2 >> 4),(ulong)(bVar2 & 0xf));
        }
      }
    }
    else {
      fwrite("Found BIT analog table, but DACLOAD table already referenced from info table!\n",0x4e,
             1,_stderr);
      iVar6 = -0x11;
    }
  }
  return iVar6;
}

Assistant:

int envy_bios_parse_bit_A (struct envy_bios *bios, struct envy_bios_bit_entry *bit) {
	struct envy_bios_dacload *dacload = &bios->dacload;
	dacload->bit = bit;
	int wantlen = 3;
	if (bit->t_len < wantlen) {
		ENVY_BIOS_ERR("Analog load table too short: %d < %d\n", bit->t_len, wantlen);
		return -EINVAL;
	}
	if (bit->t_len > wantlen)
		ENVY_BIOS_WARN("Analog load table longer than expected: %d > %d\n", bit->t_len, wantlen);
	if (dacload->valid) {
		ENVY_BIOS_ERR("Found BIT analog table, but DACLOAD table already referenced from info table!\n");
		return -EEXIST;
	}
	int err = 0;
	err |= bios_u16(bios, bit->t_offset+0, &dacload->offset);
	err |= bios_u8(bios, bit->t_offset+2, &dacload->unk02);
	if (err)
		return -EFAULT;
	if (envy_bios_parse_dacload(bios))
		ENVY_BIOS_ERR("Failed to parse DACLOAD table at 0x%04x version %d.%d\n", bios->dacload.offset, bios->dacload.version >> 4, bios->dacload.version & 0xf);
	return 0;
}